

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# efsw-test.cpp
# Opt level: O3

void __thiscall
UpdateListener::handleFileAction
          (UpdateListener *this,WatchID watchid,string *dir,string *filename,Action action,
          string *oldFilename)

{
  undefined8 *puVar1;
  pointer pcVar2;
  size_type sVar3;
  ostream *poVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  long *plVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Watch ID ",9);
  poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," DIR (",6);
  local_f0 = local_e0;
  pcVar2 = (dir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar2,pcVar2 + dir->_M_string_length);
  std::__cxx11::string::append((char *)&local_f0);
  sVar3 = oldFilename->_M_string_length;
  if (sVar3 == 0) {
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  }
  else {
    std::operator+(&local_50,"from file ",oldFilename);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_110 = &local_100;
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_100 = *puVar7;
      lStack_f8 = plVar5[3];
    }
    else {
      local_100 = *puVar7;
      local_110 = (ulong *)*plVar5;
    }
    local_108 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  uVar9 = 0xf;
  if (local_f0 != local_e0) {
    uVar9 = local_e0[0];
  }
  if (uVar9 < (ulong)(local_108 + local_e8)) {
    uVar9 = 0xf;
    if (local_110 != &local_100) {
      uVar9 = local_100;
    }
    if ((ulong)(local_108 + local_e8) <= uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_f0);
      goto LAB_001052fe;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
LAB_001052fe:
  local_d0 = &local_c0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = puVar6[3];
  }
  else {
    local_c0 = *puVar1;
    local_d0 = (undefined8 *)*puVar6;
  }
  local_c8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)(filename->_M_dataplus)._M_p);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar8;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar5[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_b0,local_a8);
  getActionName_abi_cxx11_(&local_70,this,action);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if ((sVar3 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  return;
}

Assistant:

void handleFileAction( efsw::WatchID watchid, const std::string& dir,
						   const std::string& filename, efsw::Action action,
						   std::string oldFilename = "" ) override {
		std::cout << "Watch ID " << watchid << " DIR ("
				  << dir + ") FILE (" +
						 ( oldFilename.empty() ? "" : "from file " + oldFilename + " to " ) +
						 filename + ") has event "
				  << getActionName( action ) << std::endl;
	}